

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

shared_ptr<polyscope::render::TextureBuffer> __thiscall
polyscope::render::ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_>::getRenderTextureBuffer
          (ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *this)

{
  bool bVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<polyscope::render::TextureBuffer> sVar3;
  ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *in_stack_00000040;
  allocator *in_stack_ffffffffffffff78;
  shared_ptr<polyscope::render::TextureBuffer> *in_stack_ffffffffffffff80;
  allocator local_41;
  string local_40 [16];
  Engine *in_stack_ffffffffffffffd0;
  DeviceBufferType in_stack_ffffffffffffffdc;
  element_type *in_stack_ffffffffffffffe0;
  
  checkDeviceBufferTypeIsTexture
            ((ManagedBuffer<glm::vec<2,_float,_(glm::qualifier)0>_> *)in_stack_ffffffffffffffd0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x80));
  if (!bVar1) {
    ensureHostBufferPopulated(in_stack_00000040);
    in_stack_ffffffffffffff80 =
         (shared_ptr<polyscope::render::TextureBuffer> *)&stack0xffffffffffffffe0;
    generateTextureBuffer<glm::vec<2,float,(glm::qualifier)0>>
              (in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    std::shared_ptr<polyscope::render::TextureBuffer>::operator=
              (in_stack_ffffffffffffff80,
               (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_ffffffffffffff78);
    std::shared_ptr<polyscope::render::TextureBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::TextureBuffer> *)0x414334);
    switch(*(undefined4 *)(in_RSI + 0x90)) {
    case 0:
      in_stack_ffffffffffffff78 = &local_41;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"bad call",in_stack_ffffffffffffff78);
      exception((string *)in_stack_ffffffffffffffe0);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
      break;
    case 1:
      peVar2 = std::
               __shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4143f5);
      (*peVar2->_vptr_TextureBuffer[2])(peVar2,(ulong)*(uint *)(in_RSI + 0x94));
      break;
    case 2:
      peVar2 = std::
               __shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41441c);
      (*peVar2->_vptr_TextureBuffer[3])
                (peVar2,(ulong)*(uint *)(in_RSI + 0x94),(ulong)*(uint *)(in_RSI + 0x98));
      break;
    case 3:
      peVar2 = std::
               __shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x414449);
      (*peVar2->_vptr_TextureBuffer[4])
                (peVar2,(ulong)*(uint *)(in_RSI + 0x94),(ulong)*(uint *)(in_RSI + 0x98),
                 (ulong)*(uint *)(in_RSI + 0x9c));
    }
    peVar2 = std::
             __shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x41447a);
    (*peVar2->_vptr_TextureBuffer[5])(peVar2,*(undefined8 *)(in_RSI + 0x38));
  }
  std::shared_ptr<polyscope::render::TextureBuffer>::shared_ptr
            (in_stack_ffffffffffffff80,
             (shared_ptr<polyscope::render::TextureBuffer> *)in_stack_ffffffffffffff78);
  sVar3.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar3.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<render::TextureBuffer> ManagedBuffer<T>::getRenderTextureBuffer() {
  checkDeviceBufferTypeIsTexture();

  if (!renderTextureBuffer) {
    ensureHostBufferPopulated(); // warning: the order of these matters because of how hostBufferPopulated works

    renderTextureBuffer = generateTextureBuffer<T>(deviceBufferType, render::engine);

    // templatize this?
    switch (deviceBufferType) {
    case DeviceBufferType::Attribute:
      exception("bad call");
      break;
    case DeviceBufferType::Texture1d:
      renderTextureBuffer->resize(sizeX);
      break;
    case DeviceBufferType::Texture2d:
      renderTextureBuffer->resize(sizeX, sizeY);
      break;
    case DeviceBufferType::Texture3d:
      renderTextureBuffer->resize(sizeX, sizeY, sizeZ);
      break;
    }

    renderTextureBuffer->setData(data);
  }
  return renderTextureBuffer;
}